

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fillpen.c
# Opt level: O0

fillpen_t *
fillpen_init(dict_t *dict,char *file,float64 silprob,float64 fillprob,float64 lw,float64 wip,
            logmath_t *logmath)

{
  float64 fVar1;
  int32 iVar2;
  int32 iVar3;
  int iVar4;
  fillpen_t *pfVar5;
  int32 *piVar6;
  FILE *__stream;
  char *pcVar7;
  fillpen_t *_fillpen;
  char local_868 [4];
  int32 k;
  char wd [1024];
  char line [1024];
  FILE *fp;
  float64 prob;
  s3wid_t bw;
  s3wid_t w;
  logmath_t *logmath_local;
  float64 wip_local;
  float64 lw_local;
  float64 fillprob_local;
  float64 silprob_local;
  char *file_local;
  dict_t *dict_local;
  
  _bw = logmath;
  logmath_local = (logmath_t *)wip;
  wip_local = lw;
  lw_local = fillprob;
  fillprob_local = silprob;
  silprob_local = (float64)file;
  file_local = (char *)dict;
  pfVar5 = (fillpen_t *)
           __ckd_calloc__(1,0x30,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
                          ,0x5c);
  pfVar5->dict = (dict_t *)file_local;
  pfVar5->lw = wip_local;
  pfVar5->wip = (float64)logmath_local;
  pfVar5->silprob = fillprob_local;
  pfVar5->fillerprob = lw_local;
  if (*(int *)(file_local + 0x3c) < *(int *)(file_local + 0x38)) {
    pfVar5->prob = (int32 *)0x0;
  }
  else {
    piVar6 = (int32 *)__ckd_calloc__((long)((*(int *)(file_local + 0x3c) -
                                            *(int *)(file_local + 0x38)) + 1),4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
                                     ,0x66);
    pfVar5->prob = piVar6;
  }
  fp = (FILE *)lw_local;
  for (prob._4_4_ = *(int *)(file_local + 0x38); prob._4_4_ <= *(int *)(file_local + 0x3c);
      prob._4_4_ = prob._4_4_ + 1) {
    iVar2 = logs3(_bw,(float64)fp);
    fVar1 = wip_local;
    iVar3 = logs3(_bw,(float64)logmath_local);
    pfVar5->prob[prob._4_4_ - *(int *)(file_local + 0x38)] =
         (int)((double)iVar2 * (double)fVar1 + (double)iVar3);
  }
  prob._4_4_ = dict_wordid((dict_t *)file_local,"<sil>");
  if (((prob._4_4_ < 0) || (prob._4_4_ < *(int *)(file_local + 0x38))) ||
     (*(int *)(file_local + 0x3c) < prob._4_4_)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
            ,0x74,"%s not a filler word in the given dictionary\n","<sil>");
    exit(1);
  }
  fp = (FILE *)fillprob_local;
  iVar2 = logs3(_bw,fillprob_local);
  fVar1 = wip_local;
  iVar3 = logs3(_bw,(float64)logmath_local);
  pfVar5->prob[prob._4_4_ - *(int *)(file_local + 0x38)] =
       (int)((double)iVar2 * (double)fVar1 + (double)iVar3);
  if (silprob_local != 0.0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
            ,0x7d,"Reading filler penalty file: %s\n",silprob_local);
    __stream = fopen((char *)silprob_local,"r");
    if (__stream == (FILE *)0x0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
              ,0x7f,"fopen(%s,r) failed\n",silprob_local);
      exit(1);
    }
    while (pcVar7 = fgets(wd + 0x3f8,0x400,__stream), pcVar7 != (char *)0x0) {
      if (wd[0x3f8] != '#') {
        iVar4 = __isoc99_sscanf(wd + 0x3f8,"%s %lf",local_868,&fp);
        if ((iVar4 != 0) && (iVar4 != 2)) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
                  ,0x86,"Bad input line: %s\n",wd + 0x3f8);
          exit(1);
        }
        prob._4_4_ = dict_wordid((dict_t *)file_local,local_868);
        if (((prob._4_4_ < 0) || (prob._4_4_ < *(int *)(file_local + 0x38))) ||
           (*(int *)(file_local + 0x3c) < prob._4_4_)) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
                  ,0x8b,"%s not a filler word in the given dictionary\n","<sil>");
          exit(1);
        }
        iVar2 = logs3(_bw,(float64)fp);
        fVar1 = wip_local;
        iVar3 = logs3(_bw,(float64)logmath_local);
        pfVar5->prob[prob._4_4_ - *(int *)(file_local + 0x38)] =
             (int)((double)iVar2 * (double)fVar1 + (double)iVar3);
      }
    }
    fclose(__stream);
    for (prob._4_4_ = *(int *)(file_local + 0x38); prob._4_4_ <= *(int *)(file_local + 0x3c);
        prob._4_4_ = prob._4_4_ + 1) {
      iVar4 = *(int *)(*(long *)(file_local + 0x20) + (long)prob._4_4_ * 0x20 + 0x18);
      if (iVar4 != prob._4_4_) {
        pfVar5->prob[prob._4_4_ - *(int *)(file_local + 0x38)] =
             pfVar5->prob[iVar4 - *(int *)(file_local + 0x38)];
      }
    }
  }
  return pfVar5;
}

Assistant:

fillpen_t *
fillpen_init(dict_t * dict, const char *file, float64 silprob, float64 fillprob,
             float64 lw, float64 wip, logmath_t *logmath)
{
    s3wid_t w, bw;
    float64 prob;
    FILE *fp;
    char line[1024], wd[1024];
    int32 k;
    fillpen_t *_fillpen;

    _fillpen = (fillpen_t *) ckd_calloc(1, sizeof(fillpen_t));

    _fillpen->dict = dict;
    _fillpen->lw = lw;
    _fillpen->wip = wip;
    _fillpen->silprob = silprob;
    _fillpen->fillerprob = fillprob;
    if (dict->filler_end >= dict->filler_start)
        _fillpen->prob =
            (int32 *) ckd_calloc(dict->filler_end - dict->filler_start + 1,
                                 sizeof(int32));
    else
        _fillpen->prob = NULL;

    /* Initialize all words with filler penalty (HACK!! backward compatibility) */
    prob = fillprob;
    for (w = dict->filler_start; w <= dict->filler_end; w++)
    _fillpen->prob[w - dict->filler_start] =
        (int32) ((logs3(logmath, prob) * lw + logs3(logmath, wip)));

    /* Overwrite silence penalty (HACK!! backward compatibility) */
    w = dict_wordid(dict, S3_SILENCE_WORD);
    if (NOT_S3WID(w) || (w < dict->filler_start) || (w > dict->filler_end))
        E_FATAL("%s not a filler word in the given dictionary\n",
                S3_SILENCE_WORD);
    prob = silprob;
    _fillpen->prob[w - dict->filler_start] =
        (int32) ((logs3(logmath, prob) * lw + logs3(logmath, wip)));

    /* Overwrite with filler prob input file, if specified */
    if (!file)
        return _fillpen;

    E_INFO("Reading filler penalty file: %s\n", file);
    if ((fp = fopen(file, "r")) == NULL)
        E_FATAL("fopen(%s,r) failed\n", file);
    while (fgets(line, sizeof(line), fp) != NULL) {
        if (line[0] == '#')     /* Skip comment lines */
            continue;

        k = sscanf(line, "%s %lf", wd, &prob);
        if ((k != 0) && (k != 2))
            E_FATAL("Bad input line: %s\n", line);
        w = dict_wordid(dict, wd);
        if (NOT_S3WID(w) || (w < dict->filler_start)
            || (w > dict->filler_end))
            E_FATAL("%s not a filler word in the given dictionary\n",
                    S3_SILENCE_WORD);

        _fillpen->prob[w - dict->filler_start] =
            (int32) ((logs3(logmath, prob) * lw + logs3(logmath, wip)));
    }
    fclose(fp);

    /* Replicate fillpen values for alternative pronunciations */
    for (w = dict->filler_start; w <= dict->filler_end; w++) {
        bw = dict_basewid(dict, w);
        if (bw != w)
            _fillpen->prob[w - dict->filler_start] =
                _fillpen->prob[bw - dict->filler_start];
    }

    return _fillpen;
}